

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O0

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  const_reference pvVar2;
  size_type sVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  bool bVar4;
  uchar *ptr_6;
  int size_3;
  Mat *bottom_blob_13;
  size_t b_13;
  uchar *outptr_6;
  int q_3;
  Mat *top_blob_6;
  Mat *bottom_blob_12;
  size_t b_12;
  int top_d;
  int channels_3;
  int h_3;
  int w_4;
  uchar *ptr_5;
  Mat *bottom_blob_11;
  size_t b_11;
  int j;
  int i_2;
  uchar *outptr_5;
  int q_2;
  Mat *top_blob_5;
  Mat *bottom_blob_10;
  size_t b_10;
  int top_w_2;
  int channels_2;
  int d_2;
  int h_2;
  uchar *ptr_4;
  int size_2;
  Mat *bottom_blob_9;
  size_t b_9;
  int i_1;
  uchar *outptr_4;
  int q_1;
  Mat *top_blob_4;
  Mat *bottom_blob_8;
  size_t b_8;
  int top_h_1;
  int channels_1;
  int d_1;
  int w_3;
  uchar *outptr_3;
  uchar *ptr_3;
  size_t size_1;
  int channels;
  Mat *bottom_blob_7;
  size_t b_7;
  int q;
  Mat *top_blob_3;
  Mat *bottom_blob_6;
  size_t b_6;
  int top_channels;
  int d;
  int h_1;
  int w_2;
  uchar *ptr_2;
  Mat *bottom_blob_5;
  size_t b_5;
  uchar *outptr_2;
  int i;
  Mat *top_blob_2;
  Mat *bottom_blob_4;
  size_t b_4;
  int top_w_1;
  int h;
  uchar *ptr_1;
  int size;
  Mat *bottom_blob_3;
  size_t b_3;
  uchar *outptr_1;
  Mat *top_blob_1;
  Mat *bottom_blob_2;
  size_t b_2;
  int top_h;
  int w_1;
  uchar *ptr;
  int w;
  Mat *bottom_blob_1;
  size_t b_1;
  uchar *outptr;
  Mat *top_blob;
  Mat *bottom_blob;
  size_t b;
  int top_w;
  int positive_axis;
  size_t elemsize;
  int dims;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  Mat *m;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Allocator *in_stack_fffffffffffff168;
  size_t in_stack_fffffffffffff170;
  undefined8 in_stack_fffffffffffff178;
  Mat *in_stack_fffffffffffff180;
  Allocator *in_stack_fffffffffffff1e0;
  int local_c6c;
  undefined8 local_c60;
  undefined8 local_c58;
  undefined8 local_c50;
  undefined4 local_c48;
  Allocator *local_c40;
  undefined4 local_c38;
  undefined4 local_c34;
  undefined4 local_c30;
  undefined4 local_c2c;
  undefined4 local_c28;
  undefined8 local_c20;
  void *local_c18;
  int local_c0c;
  const_reference local_c08;
  ulong local_c00;
  undefined8 local_bf8;
  undefined8 local_bf0;
  undefined8 local_be8;
  undefined4 local_be0;
  Allocator *local_bd8;
  undefined4 local_bd0;
  undefined4 local_bcc;
  undefined4 local_bc8;
  undefined4 local_bc4;
  undefined4 local_bc0;
  undefined8 local_bb8;
  void *local_bb0;
  int local_ba4;
  reference local_ba0;
  const_reference local_b98;
  ulong local_b90;
  int local_b88;
  int local_b84;
  int local_b80;
  int local_b7c;
  undefined8 local_b78;
  undefined8 local_b70;
  undefined8 local_b68;
  undefined4 local_b60;
  Allocator *local_b58;
  undefined4 local_b50;
  undefined4 local_b4c;
  undefined4 local_b48;
  undefined4 local_b44;
  undefined4 local_b40;
  undefined8 local_b38;
  Allocator local_b30;
  undefined8 local_b28;
  undefined8 local_b20;
  undefined4 local_b18;
  Allocator *local_b10;
  undefined4 local_b08;
  undefined4 local_b04;
  undefined4 local_b00;
  undefined4 local_afc;
  undefined4 local_af8;
  undefined8 local_af0;
  void *local_ae8;
  const_reference local_ae0;
  ulong local_ad8;
  int local_ad0;
  int local_acc;
  undefined8 local_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8;
  undefined4 local_ab0;
  Allocator *local_aa8;
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined8 local_a88;
  void *local_a80;
  int local_a74;
  reference local_a70;
  const_reference local_a68;
  ulong local_a60;
  int local_a58;
  int local_a54;
  int local_a50;
  int local_a4c;
  undefined8 local_a48;
  undefined8 local_a40;
  undefined8 local_a38;
  undefined4 local_a30;
  Allocator *local_a28;
  undefined4 local_a20;
  undefined4 local_a1c;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined8 local_a08;
  undefined8 local_a00;
  undefined8 local_9f8;
  undefined8 local_9f0;
  undefined4 local_9e8;
  Allocator *local_9e0;
  undefined4 local_9d8;
  undefined4 local_9d4;
  undefined4 local_9d0;
  undefined4 local_9cc;
  undefined4 local_9c8;
  undefined8 local_9c0;
  void *local_9b8;
  int local_9ac;
  const_reference local_9a8;
  ulong local_9a0;
  int local_994;
  undefined8 local_990;
  undefined8 local_988;
  undefined8 local_980;
  undefined4 local_978;
  Allocator *local_970;
  undefined4 local_968;
  undefined4 local_964;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined8 local_950;
  void *local_948;
  int local_93c;
  reference local_938;
  const_reference local_930;
  ulong local_928;
  int local_91c;
  int local_918;
  int local_914;
  int local_910;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 local_8f0;
  undefined4 local_8e8;
  Allocator *local_8e0;
  undefined4 local_8d8;
  undefined4 local_8d4;
  undefined4 local_8d0;
  undefined4 local_8cc;
  undefined4 local_8c8;
  undefined8 local_8c0;
  void *local_8b8;
  void *local_8b0;
  long local_8a8;
  int local_89c;
  const_reference local_898;
  ulong local_890;
  int local_884;
  reference local_880;
  const_reference local_878;
  ulong local_870;
  int local_868;
  int local_864;
  int local_860;
  int local_85c;
  void *local_858;
  const_reference local_850;
  ulong local_848;
  void *local_840;
  int local_834;
  reference local_830;
  const_reference local_828;
  ulong local_820;
  int local_818;
  int local_814;
  void *local_810;
  int local_804;
  const_reference local_800;
  ulong local_7f8;
  void *local_7f0;
  reference local_7e8;
  const_reference local_7e0;
  ulong local_7d8;
  int local_7d0;
  int local_7cc;
  void *local_7c8;
  int local_7bc;
  const_reference local_7b8;
  ulong local_7b0;
  void *local_7a8;
  reference local_7a0;
  const_reference local_798;
  ulong local_790;
  int local_788;
  int local_784;
  size_t local_780;
  int local_774;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_768;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_760;
  reference local_748;
  reference local_740;
  reference local_738;
  reference local_730;
  reference local_728;
  reference local_720;
  reference local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  undefined8 *local_6f8;
  reference local_6f0;
  reference local_6e8;
  undefined8 *local_6e0;
  undefined8 *local_6d8;
  const_reference local_6d0;
  const_reference local_6c8;
  const_reference local_6c0;
  int local_6b4;
  reference local_6b0;
  int local_6a4;
  Allocator *local_6a0;
  int local_694;
  const_reference local_690;
  undefined1 local_685;
  int local_684;
  reference local_680;
  undefined8 *local_678;
  undefined1 local_66d;
  int local_66c;
  reference local_668;
  undefined8 *local_660;
  undefined1 local_655;
  int local_654;
  reference local_650;
  undefined8 *local_648;
  undefined1 local_63d;
  int local_63c;
  reference local_638;
  undefined8 *local_630;
  undefined8 *local_608;
  undefined8 *local_5f8;
  undefined8 *local_5e8;
  undefined8 *local_5d8;
  undefined8 *local_5c8;
  Allocator *local_5b8;
  undefined8 *local_5a8;
  undefined8 *local_598;
  undefined8 *local_588;
  undefined1 local_575;
  int local_574;
  const_reference local_570;
  undefined8 *local_568;
  undefined1 local_555;
  int local_554;
  const_reference local_550;
  undefined8 *local_548;
  undefined1 local_535;
  int local_534;
  const_reference local_530;
  undefined8 *local_528;
  int local_514;
  undefined8 *local_510;
  Allocator *local_508;
  int local_4fc;
  undefined8 *local_4f8;
  undefined8 *local_4f0;
  reference local_4e8;
  reference local_4e0;
  reference local_4d8;
  reference local_4d0;
  reference local_4c8;
  reference local_4c0;
  reference local_4b8;
  Allocator *local_4b0;
  int local_4a4;
  size_t local_4a0;
  void *local_498;
  int local_48c;
  int local_488;
  int local_484;
  undefined8 *local_480;
  Allocator *local_478;
  int local_46c;
  size_t local_468;
  void *local_460;
  int local_454;
  int local_450;
  int local_44c;
  undefined8 *local_448;
  Allocator *local_440;
  int local_434;
  size_t local_430;
  void *local_428;
  int local_41c;
  int local_418;
  int local_414;
  undefined8 *local_410;
  Allocator *local_408;
  int local_3fc;
  size_t local_3f8;
  void *local_3f0;
  int local_3e4;
  int local_3e0;
  int local_3dc;
  undefined8 *local_3d8;
  Allocator *local_3d0;
  int local_3c4;
  size_t local_3c0;
  void *local_3b8;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  undefined8 *local_3a0;
  Allocator *local_398;
  int local_38c;
  size_t local_388;
  void *local_380;
  int local_374;
  int local_370;
  int local_36c;
  undefined8 *local_368;
  Allocator *local_360;
  int local_354;
  size_t local_350;
  void *local_348;
  int local_33c;
  int local_338;
  int local_334;
  undefined8 *local_330;
  undefined4 local_324;
  long local_320;
  undefined4 local_314;
  long local_310;
  undefined4 local_304;
  long local_300;
  undefined4 local_2f4;
  long local_2f0;
  undefined4 local_2e4;
  long local_2e0;
  undefined4 local_2d4;
  long local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  undefined8 *local_270;
  undefined8 *local_250;
  undefined8 *local_230;
  Allocator *local_210;
  undefined8 *local_1f0;
  undefined8 *local_1d0;
  undefined8 *local_1b0;
  undefined8 *local_190;
  undefined8 *local_170;
  Allocator *local_60;
  int local_54;
  size_t local_50;
  void *local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  Allocator *local_30;
  int local_24;
  size_t local_20;
  void *local_18;
  int local_10;
  int local_c;
  Allocator *local_8;
  
  local_768 = in_RDX;
  local_760 = in_RSI;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_774 = pvVar2->dims;
  pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
  local_780 = pvVar2->elemsize;
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_c6c = local_774 + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_c6c = *(int *)(in_RDI + 0xd0);
  }
  local_784 = local_c6c;
  if (local_774 == 1) {
    local_788 = 0;
    for (local_790 = 0; uVar1 = local_790,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_790 = local_790 + 1) {
      local_798 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_790);
      local_788 = local_798->w + local_788;
    }
    local_7a0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_768,0);
    Mat::create(in_stack_fffffffffffff180,(int)((ulong)in_stack_fffffffffffff178 >> 0x20),
                in_stack_fffffffffffff170,in_stack_fffffffffffff168);
    local_718 = local_7a0;
    bVar4 = true;
    if (local_7a0->data != (void *)0x0) {
      local_4e8 = local_7a0;
      bVar4 = local_7a0->cstep * (long)local_7a0->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    local_6e8 = local_7a0;
    local_7a8 = local_7a0->data;
    for (local_7b0 = 0; uVar1 = local_7b0,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_7b0 = local_7b0 + 1) {
      local_7b8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_7b0);
      local_7bc = local_7b8->w;
      local_7c8 = local_7b8->data;
      local_6c0 = local_7b8;
      memcpy(local_7a8,local_7c8,(long)local_7bc * local_780);
      local_7a8 = (void *)((long)local_7bc * local_780 + (long)local_7a8);
    }
  }
  if ((local_774 == 2) && (local_784 == 0)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_7cc = pvVar2->w;
    local_7d0 = 0;
    for (local_7d8 = 0; uVar1 = local_7d8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_7d8 = local_7d8 + 1) {
      local_7e0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_7d8);
      local_7d0 = local_7e0->h + local_7d0;
    }
    local_7e8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_768,0);
    Mat::create(in_stack_fffffffffffff180,(int)((ulong)in_stack_fffffffffffff178 >> 0x20),
                (int)in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168);
    local_720 = local_7e8;
    bVar4 = true;
    if (local_7e8->data != (void *)0x0) {
      local_4e0 = local_7e8;
      bVar4 = local_7e8->cstep * (long)local_7e8->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    local_6f0 = local_7e8;
    local_7f0 = local_7e8->data;
    for (local_7f8 = 0; uVar1 = local_7f8,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_7f8 = local_7f8 + 1) {
      local_800 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_7f8);
      local_804 = local_7cc * local_800->h;
      local_810 = local_800->data;
      local_6c8 = local_800;
      memcpy(local_7f0,local_810,(long)local_804 * local_780);
      local_7f0 = (void *)((long)local_804 * local_780 + (long)local_7f0);
    }
  }
  if ((local_774 == 2) && (local_784 == 1)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_814 = pvVar2->h;
    local_818 = 0;
    for (local_820 = 0; uVar1 = local_820,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_820 = local_820 + 1) {
      local_828 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_820);
      local_818 = local_828->w + local_818;
    }
    local_830 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_768,0);
    Mat::create(in_stack_fffffffffffff180,(int)((ulong)in_stack_fffffffffffff178 >> 0x20),
                (int)in_stack_fffffffffffff178,in_stack_fffffffffffff170,in_stack_fffffffffffff168);
    local_728 = local_830;
    bVar4 = true;
    if (local_830->data != (void *)0x0) {
      local_4d8 = local_830;
      bVar4 = local_830->cstep * (long)local_830->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    for (local_834 = 0; local_834 < local_814; local_834 = local_834 + 1) {
      local_6b0 = local_830;
      local_6b4 = local_834;
      local_840 = (void *)((long)local_830->data +
                          (long)local_830->w * (long)local_834 * local_830->elemsize);
      for (local_848 = 0; uVar1 = local_848,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3
          ; local_848 = local_848 + 1) {
        local_850 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_760,local_848);
        local_694 = local_834;
        local_858 = (void *)((long)local_850->data +
                            (long)local_850->w * (long)local_834 * local_850->elemsize);
        local_690 = local_850;
        memcpy(local_840,local_858,(long)local_850->w * local_780);
        local_840 = (void *)((long)local_850->w * local_780 + (long)local_840);
      }
    }
  }
  if (((local_774 == 3) || (local_774 == 4)) && (local_784 == 0)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_85c = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_860 = pvVar2->h;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_864 = pvVar2->d;
    local_868 = 0;
    for (local_870 = 0; uVar1 = local_870,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_870 = local_870 + 1) {
      local_878 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_870);
      local_868 = local_878->c + local_868;
    }
    local_880 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_768,0);
    Mat::create(in_stack_fffffffffffff180,(int)((ulong)in_stack_fffffffffffff178 >> 0x20),
                (int)in_stack_fffffffffffff178,(int)(in_stack_fffffffffffff170 >> 0x20),
                (int)in_stack_fffffffffffff170,(size_t)in_stack_fffffffffffff168,
                in_stack_fffffffffffff1e0);
    local_730 = local_880;
    bVar4 = true;
    if (local_880->data != (void *)0x0) {
      local_4d0 = local_880;
      bVar4 = local_880->cstep * (long)local_880->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    local_880->dims = local_774;
    local_884 = 0;
    for (local_890 = 0; uVar1 = local_890,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_890 = local_890 + 1) {
      local_898 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_890);
      local_89c = local_898->c;
      local_8a8 = local_898->cstep * (long)local_89c;
      local_8b0 = local_898->data;
      local_630 = &local_900;
      local_3dc = local_880->w;
      local_3e0 = local_880->h;
      local_3e4 = local_880->d;
      local_8b8 = (void *)((long)local_880->data +
                          local_880->cstep * (long)local_884 * local_880->elemsize);
      local_3f8 = local_880->elemsize;
      local_3fc = local_880->elempack;
      local_408 = local_880->allocator;
      local_3d8 = &local_900;
      local_2f0 = (long)local_3dc * (long)local_3e0 * local_3f8;
      local_6f8 = &local_900;
      local_608 = &local_900;
      local_2f4 = 0x10;
      local_638 = local_880;
      local_63c = local_884;
      local_63d = 1;
      local_900 = 0;
      local_8f0 = 0;
      local_8e8 = 0;
      local_8d8 = 0;
      local_8d4 = 0;
      local_8d0 = 0;
      local_8cc = 0;
      local_8c8 = 0;
      local_8c0 = 0;
      local_8f8 = 0;
      local_6d0 = local_898;
      local_3f0 = local_8b8;
      local_170 = local_608;
      local_8e0 = local_408;
      memcpy(local_8b8,local_8b0,local_8a8 * local_780);
      local_884 = local_89c + local_884;
    }
  }
  if (((local_774 == 3) && (local_784 == 1)) || ((local_774 == 4 && (local_784 == 2)))) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_910 = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_914 = pvVar2->d;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_918 = pvVar2->c;
    local_91c = 0;
    for (local_928 = 0; uVar1 = local_928,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_928 = local_928 + 1) {
      local_930 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_928);
      local_91c = local_930->h + local_91c;
    }
    local_938 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_768,0);
    Mat::create(in_stack_fffffffffffff180,(int)((ulong)in_stack_fffffffffffff178 >> 0x20),
                (int)in_stack_fffffffffffff178,(int)(in_stack_fffffffffffff170 >> 0x20),
                (int)in_stack_fffffffffffff170,(size_t)in_stack_fffffffffffff168,
                in_stack_fffffffffffff1e0);
    local_738 = local_938;
    bVar4 = true;
    if (local_938->data != (void *)0x0) {
      local_4c8 = local_938;
      bVar4 = local_938->cstep * (long)local_938->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    local_938->dims = local_774;
    for (local_93c = 0; local_93c < local_918; local_93c = local_93c + 1) {
      local_648 = &local_990;
      local_3a4 = local_938->w;
      local_3a8 = local_938->h;
      local_3ac = local_938->d;
      local_948 = (void *)((long)local_938->data +
                          local_938->cstep * (long)local_93c * local_938->elemsize);
      local_3c0 = local_938->elemsize;
      local_3c4 = local_938->elempack;
      local_3d0 = local_938->allocator;
      local_3a0 = &local_990;
      local_300 = (long)local_3a4 * (long)local_3a8 * local_3c0;
      local_700 = &local_990;
      local_5f8 = &local_990;
      local_304 = 0x10;
      local_650 = local_938;
      local_654 = local_93c;
      local_655 = 1;
      local_990 = 0;
      local_980 = 0;
      local_978 = 0;
      local_968 = 0;
      local_964 = 0;
      local_960 = 0;
      local_95c = 0;
      local_958 = 0;
      local_950 = 0;
      local_988 = 0;
      local_3b8 = local_948;
      local_190 = local_5f8;
      local_970 = local_3d0;
      for (local_994 = 0; local_994 < local_914; local_994 = local_994 + 1) {
        for (local_9a0 = 0; uVar1 = local_9a0,
            sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760),
            uVar1 < sVar3; local_9a0 = local_9a0 + 1) {
          local_9a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                (local_760,local_9a0);
          local_9ac = local_9a8->w * local_9a8->h;
          local_528 = &local_a48;
          local_484 = local_9a8->w;
          local_488 = local_9a8->h;
          local_48c = local_9a8->d;
          local_498 = (void *)((long)local_9a8->data +
                              local_9a8->cstep * (long)local_93c * local_9a8->elemsize);
          local_4a0 = local_9a8->elemsize;
          local_4a4 = local_9a8->elempack;
          local_4b0 = local_9a8->allocator;
          local_480 = &local_a48;
          local_2c0 = (long)local_484 * (long)local_488 * local_4a0;
          local_4f0 = &local_a00;
          local_4f8 = &local_a48;
          local_9b8 = (void *)((long)local_498 +
                              (long)local_484 * (long)local_488 * (long)local_994 * local_4a0);
          local_38 = &local_a00;
          local_6d8 = &local_a00;
          local_5e8 = &local_a00;
          local_5d8 = &local_a48;
          local_9c0 = 0;
          local_9c8 = 0;
          local_9cc = 0;
          local_9d0 = 0;
          local_9d4 = 0;
          local_9d8 = 0;
          local_9e8 = 0;
          local_9f0 = 0;
          local_9f8 = 0;
          local_a00 = 0;
          local_2c4 = 0x10;
          local_4fc = local_994;
          local_534 = local_93c;
          local_535 = 1;
          local_a48 = 0;
          local_a38 = 0;
          local_a30 = 0;
          local_a20 = 0;
          local_a1c = 0;
          local_a18 = 0;
          local_a14 = 0;
          local_a10 = 0;
          local_a08 = 0;
          local_a40 = 0;
          local_530 = local_9a8;
          local_1d0 = local_5d8;
          local_1b0 = local_5e8;
          local_60 = local_4b0;
          local_54 = local_4a4;
          local_50 = local_4a0;
          local_48 = local_9b8;
          local_40 = local_488;
          local_3c = local_484;
          local_a28 = local_4b0;
          local_9e0 = local_4b0;
          memcpy(local_948,local_9b8,(long)local_9ac * local_780);
          local_948 = (void *)((long)local_9ac * local_780 + (long)local_948);
        }
      }
    }
  }
  if (((local_774 == 3) && (local_784 == 2)) || ((local_774 == 4 && (local_784 == 3)))) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_a4c = pvVar2->h;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_a50 = pvVar2->d;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_a54 = pvVar2->c;
    local_a58 = 0;
    for (local_a60 = 0; uVar1 = local_a60,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_a60 = local_a60 + 1) {
      local_a68 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_a60);
      local_a58 = local_a68->w + local_a58;
    }
    local_a70 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_768,0);
    Mat::create(in_stack_fffffffffffff180,(int)((ulong)in_stack_fffffffffffff178 >> 0x20),
                (int)in_stack_fffffffffffff178,(int)(in_stack_fffffffffffff170 >> 0x20),
                (int)in_stack_fffffffffffff170,(size_t)in_stack_fffffffffffff168,
                in_stack_fffffffffffff1e0);
    local_740 = local_a70;
    bVar4 = true;
    if (local_a70->data != (void *)0x0) {
      local_4c0 = local_a70;
      bVar4 = local_a70->cstep * (long)local_a70->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    local_a70->dims = local_774;
    for (local_a74 = 0; local_a74 < local_a54; local_a74 = local_a74 + 1) {
      local_660 = &local_ac8;
      local_36c = local_a70->w;
      local_370 = local_a70->h;
      local_374 = local_a70->d;
      local_a80 = (void *)((long)local_a70->data +
                          local_a70->cstep * (long)local_a74 * local_a70->elemsize);
      local_388 = local_a70->elemsize;
      local_38c = local_a70->elempack;
      local_398 = local_a70->allocator;
      local_368 = &local_ac8;
      local_310 = (long)local_36c * (long)local_370 * local_388;
      local_708 = &local_ac8;
      local_5c8 = &local_ac8;
      local_314 = 0x10;
      local_668 = local_a70;
      local_66c = local_a74;
      local_66d = 1;
      local_ac8 = 0;
      local_ab8 = 0;
      local_ab0 = 0;
      local_aa0 = 0;
      local_a9c = 0;
      local_a98 = 0;
      local_a94 = 0;
      local_a90 = 0;
      local_a88 = 0;
      local_ac0 = 0;
      local_380 = local_a80;
      local_1f0 = local_5c8;
      local_aa8 = local_398;
      for (local_acc = 0; local_acc < local_a50; local_acc = local_acc + 1) {
        for (local_ad0 = 0; local_ad0 < local_a4c; local_ad0 = local_ad0 + 1) {
          for (local_ad8 = 0; uVar1 = local_ad8,
              sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760),
              uVar1 < sVar3; local_ad8 = local_ad8 + 1) {
            local_ae0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                                  (local_760,local_ad8);
            local_548 = &local_b78;
            local_44c = local_ae0->w;
            local_450 = local_ae0->h;
            local_454 = local_ae0->d;
            local_460 = (void *)((long)local_ae0->data +
                                local_ae0->cstep * (long)local_a74 * local_ae0->elemsize);
            local_468 = local_ae0->elemsize;
            local_46c = local_ae0->elempack;
            local_478 = local_ae0->allocator;
            local_448 = &local_b78;
            local_2d0 = (long)local_44c * (long)local_450 * local_468;
            local_508 = &local_b30;
            local_510 = &local_b78;
            local_18 = (void *)((long)local_460 +
                               (long)local_44c * (long)local_450 * (long)local_acc * local_468);
            local_8 = &local_b30;
            local_6a0 = &local_b30;
            local_ae8 = (void *)((long)local_18 + (long)local_44c * (long)local_ad0 * local_468);
            in_stack_fffffffffffff1e0 = &local_b30;
            local_5a8 = &local_b78;
            local_af0 = 0;
            local_af8 = 0;
            local_afc = 0;
            local_b00 = 0;
            local_b04 = 0;
            local_b08 = 0;
            local_b18 = 0;
            local_b20 = 0;
            local_b28 = 0;
            local_b30._vptr_Allocator = (_func_int **)0x0;
            local_2d4 = 0x10;
            local_514 = local_acc;
            local_554 = local_a74;
            local_555 = 1;
            local_6a4 = local_ad0;
            local_b78 = 0;
            local_b68 = 0;
            local_b60 = 0;
            local_b50 = 0;
            local_b4c = 0;
            local_b48 = 0;
            local_b44 = 0;
            local_b40 = 0;
            local_b38 = 0;
            local_b70 = 0;
            local_5b8 = in_stack_fffffffffffff1e0;
            local_550 = local_ae0;
            local_230 = local_5a8;
            local_210 = in_stack_fffffffffffff1e0;
            local_30 = local_478;
            local_24 = local_46c;
            local_20 = local_468;
            local_10 = local_450;
            local_c = local_44c;
            local_b58 = local_478;
            local_b10 = local_478;
            memcpy(local_a80,local_ae8,(long)local_ae0->w * local_780);
            local_a80 = (void *)((long)local_ae0->w * local_780 + (long)local_a80);
          }
        }
      }
    }
  }
  if ((local_774 == 4) && (local_784 == 1)) {
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_b7c = pvVar2->w;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_b80 = pvVar2->h;
    pvVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_760,0);
    local_b84 = pvVar2->c;
    local_b88 = 0;
    for (local_b90 = 0; uVar1 = local_b90,
        sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3;
        local_b90 = local_b90 + 1) {
      local_b98 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                            (local_760,local_b90);
      local_b88 = local_b98->d + local_b88;
    }
    local_ba0 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_768,0);
    Mat::create(in_stack_fffffffffffff180,(int)((ulong)in_stack_fffffffffffff178 >> 0x20),
                (int)in_stack_fffffffffffff178,(int)(in_stack_fffffffffffff170 >> 0x20),
                (int)in_stack_fffffffffffff170,(size_t)in_stack_fffffffffffff168,
                in_stack_fffffffffffff1e0);
    local_748 = local_ba0;
    bVar4 = true;
    if (local_ba0->data != (void *)0x0) {
      local_4b8 = local_ba0;
      bVar4 = local_ba0->cstep * (long)local_ba0->c == 0;
    }
    if (bVar4) {
      return -100;
    }
    for (local_ba4 = 0; local_ba4 < local_b84; local_ba4 = local_ba4 + 1) {
      local_678 = &local_bf8;
      local_334 = local_ba0->w;
      local_338 = local_ba0->h;
      local_33c = local_ba0->d;
      local_bb0 = (void *)((long)local_ba0->data +
                          local_ba0->cstep * (long)local_ba4 * local_ba0->elemsize);
      local_350 = local_ba0->elemsize;
      local_354 = local_ba0->elempack;
      local_360 = local_ba0->allocator;
      local_330 = &local_bf8;
      local_320 = (long)local_334 * (long)local_338 * local_350;
      local_710 = &local_bf8;
      local_598 = &local_bf8;
      local_324 = 0x10;
      local_680 = local_ba0;
      local_684 = local_ba4;
      local_685 = 1;
      local_bf8 = 0;
      local_be8 = 0;
      local_be0 = 0;
      local_bd0 = 0;
      local_bcc = 0;
      local_bc8 = 0;
      local_bc4 = 0;
      local_bc0 = 0;
      local_bb8 = 0;
      local_bf0 = 0;
      local_348 = local_bb0;
      local_250 = local_598;
      local_bd8 = local_360;
      for (local_c00 = 0; uVar1 = local_c00,
          sVar3 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_760), uVar1 < sVar3
          ; local_c00 = local_c00 + 1) {
        local_c08 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (local_760,local_c00);
        local_c0c = local_c08->w * local_c08->h * local_c08->d;
        local_568 = &local_c60;
        local_414 = local_c08->w;
        local_418 = local_c08->h;
        local_41c = local_c08->d;
        local_c18 = (void *)((long)local_c08->data +
                            local_c08->cstep * (long)local_ba4 * local_c08->elemsize);
        local_430 = local_c08->elemsize;
        local_434 = local_c08->elempack;
        local_440 = local_c08->allocator;
        local_410 = &local_c60;
        local_2e0 = (long)local_414 * (long)local_418 * local_430;
        local_6e0 = &local_c60;
        local_588 = &local_c60;
        local_2e4 = 0x10;
        local_574 = local_ba4;
        local_575 = 1;
        local_c60 = 0;
        local_c50 = 0;
        local_c48 = 0;
        local_c38 = 0;
        local_c34 = 0;
        local_c30 = 0;
        local_c2c = 0;
        local_c28 = 0;
        local_c20 = 0;
        local_c58 = 0;
        local_570 = local_c08;
        local_428 = local_c18;
        local_270 = local_588;
        local_c40 = local_440;
        memcpy(local_bb0,local_c18,(long)local_c0c * local_780);
        local_bb0 = (void *)((long)local_c0c * local_780 + (long)local_bb0);
      }
    }
  }
  return 0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, d, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    int size = bottom_blob.w * bottom_blob.h;

                    const unsigned char* ptr = bottom_blob.channel(q).depth(i);
                    memcpy(outptr, ptr, size * elemsize);

                    outptr += size * elemsize;
                }
            }
        }
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int d = bottom_blobs[0].d;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        top_blob.dims = dims;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < d; i++)
            {
                for (int j = 0; j < h; j++)
                {
                    for (size_t b = 0; b < bottom_blobs.size(); b++)
                    {
                        const Mat& bottom_blob = bottom_blobs[b];

                        const unsigned char* ptr = bottom_blob.channel(q).depth(i).row<const unsigned char>(j);
                        memcpy(outptr, ptr, bottom_blob.w * elemsize);

                        outptr += bottom_blob.w * elemsize;
                    }
                }
            }
        }
    }

    if (dims == 4 && positive_axis == 1)
    {
        // interleave dim depth
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total depth
        int top_d = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_d += bottom_blob.d;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_d, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h * bottom_blob.d;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }
    }

    return 0;
}